

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall diligent_spirv_cross::Compiler::analyze_image_and_sampler_usage(Compiler *this)

{
  uint32_t uVar1;
  SPIRFunction *pSVar2;
  size_type sVar3;
  value_type *__x;
  undefined1 local_120 [16];
  CombinedImageSampler *combined;
  CombinedImageSampler *__end1;
  CombinedImageSampler *__begin1;
  SmallVector<diligent_spirv_cross::CombinedImageSampler,_8UL> *__range1;
  CombinedImageSamplerUsageHandler handler;
  undefined1 local_58 [8];
  CombinedImageSamplerDrefHandler dref_handler;
  Compiler *this_local;
  
  dref_handler.dref_combined_samplers._M_h._M_single_bucket = (__node_base_ptr)this;
  CombinedImageSamplerDrefHandler::CombinedImageSamplerDrefHandler
            ((CombinedImageSamplerDrefHandler *)local_58,this);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  pSVar2 = get<diligent_spirv_cross::SPIRFunction>(this,uVar1);
  traverse_all_reachable_opcodes(this,pSVar2,(OpcodeHandler *)local_58);
  CombinedImageSamplerUsageHandler::CombinedImageSamplerUsageHandler
            ((CombinedImageSamplerUsageHandler *)&__range1,this,
             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&dref_handler.compiler);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  pSVar2 = get<diligent_spirv_cross::SPIRFunction>(this,uVar1);
  traverse_all_reachable_opcodes(this,pSVar2,(OpcodeHandler *)&__range1);
  ::std::
  unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::clear((unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
           *)&handler.dref_combined_samplers);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  pSVar2 = get<diligent_spirv_cross::SPIRFunction>(this,uVar1);
  traverse_all_reachable_opcodes(this,pSVar2,(OpcodeHandler *)&__range1);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::operator=(&this->comparison_ids,
              (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&handler.dependency_hierarchy._M_h._M_single_bucket);
  this->need_subpass_input = (bool)((byte)handler.comparison_ids._M_h._M_single_bucket & 1);
  this->need_subpass_input_ms = (bool)(handler.comparison_ids._M_h._M_single_bucket._1_1_ & 1);
  __begin1 = (CombinedImageSampler *)&this->combined_image_samplers;
  __end1 = VectorView<diligent_spirv_cross::CombinedImageSampler>::begin
                     ((VectorView<diligent_spirv_cross::CombinedImageSampler> *)__begin1);
  combined = VectorView<diligent_spirv_cross::CombinedImageSampler>::end
                       ((VectorView<diligent_spirv_cross::CombinedImageSampler> *)__begin1);
  for (; __end1 != combined; __end1 = __end1 + 1) {
    local_120._8_8_ = __end1;
    local_120._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->sampler_id);
    sVar3 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->comparison_ids,(key_type *)(local_120 + 4));
    if (sVar3 != 0) {
      local_120._0_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)local_120._8_8_);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               &this->comparison_ids,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_120,__x);
    }
  }
  CombinedImageSamplerUsageHandler::~CombinedImageSamplerUsageHandler
            ((CombinedImageSamplerUsageHandler *)&__range1);
  CombinedImageSamplerDrefHandler::~CombinedImageSamplerDrefHandler
            ((CombinedImageSamplerDrefHandler *)local_58);
  return;
}

Assistant:

void Compiler::analyze_image_and_sampler_usage()
{
	CombinedImageSamplerDrefHandler dref_handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), dref_handler);

	CombinedImageSamplerUsageHandler handler(*this, dref_handler.dref_combined_samplers);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	// Need to run this traversal twice. First time, we propagate any comparison sampler usage from leaf functions
	// down to main().
	// In the second pass, we can propagate up forced depth state coming from main() up into leaf functions.
	handler.dependency_hierarchy.clear();
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	comparison_ids = std::move(handler.comparison_ids);
	need_subpass_input = handler.need_subpass_input;
	need_subpass_input_ms = handler.need_subpass_input_ms;

	// Forward information from separate images and samplers into combined image samplers.
	for (auto &combined : combined_image_samplers)
		if (comparison_ids.count(combined.sampler_id))
			comparison_ids.insert(combined.combined_id);
}